

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_5::RepeatedVarint_UInt64_Test::~RepeatedVarint_UInt64_Test
          (RepeatedVarint_UInt64_Test *this)

{
  RepeatedVarint_UInt64_Test *this_local;
  
  ~RepeatedVarint_UInt64_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedVarint, UInt64) {
  RepeatedField<uint64_t> v;

  // Insert 2^n and 2^n-1.
  for (int n = 0; n < 10; n++) {
    v.Add(1 << n);
    v.Add((1 << n) - 1);
  }

  // Check consistency with the scalar UInt64Size.
  size_t expected = 0;
  for (int i = 0; i < v.size(); i++) {
    expected += WireFormatLite::UInt64Size(v[i]);
  }

  EXPECT_EQ(expected, WireFormatLite::UInt64Size(v));
}